

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpu384a_com.c
# Opt level: O1

void vdpu384a_setup_down_scale(MppFrame frame,MppDev dev,Vdpu384aCtrlReg *com,void *comParas)

{
  RK_U32 RVar1;
  RK_U32 RVar2;
  MppFrameFormat MVar3;
  MppFrameFormat MVar4;
  MppMeta meta;
  size_t sVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  RVar1 = mpp_frame_get_height(frame);
  RVar2 = mpp_frame_get_width(frame);
  RVar2 = (RVar2 >> 1) + 0xf & 0xfffffff0;
  MVar3 = mpp_frame_get_fmt(frame);
  meta = mpp_frame_get_meta(frame);
  MVar4 = mpp_frame_get_fmt(frame);
  if ((MVar4 & 0xf00000) == MPP_FMT_YUV420SP) {
    RVar2 = mpp_align_128_odd_plus_64(RVar2);
    RVar1 = mpp_frame_get_ver_stride(frame);
    uVar8 = RVar1 >> 1;
  }
  else {
    uVar8 = (RVar1 >> 1) + 0xf & 0xfffffff0;
  }
  uVar8 = uVar8 * RVar2;
  MVar3 = MVar3 & 0xfffff;
  if (MVar3 < MPP_FMT_YUV400) {
    if ((MPP_FMT_YUV420SP_10BIT < MVar3) && (MVar3 - MPP_FMT_YUV422SP < 2)) {
      uVar7 = uVar8 * 2;
      goto LAB_00271ba7;
    }
  }
  else {
    uVar7 = uVar8;
    if (MVar3 == MPP_FMT_YUV400) goto LAB_00271ba7;
    if (MVar3 == MPP_FMT_YUV444SP) {
      uVar7 = uVar8 * 3;
      goto LAB_00271ba7;
    }
  }
  uVar7 = uVar8 * 3 >> 1;
LAB_00271ba7:
  sVar5 = mpp_frame_get_buf_size(frame);
  com->reg9 = (SWREG9_IMPORTANT_EN_conflict)((uint)com->reg9 & 0xfffffedf | 0x20);
  *(RK_U32 *)((long)comParas + 0x1c) = RVar2 >> 4;
  uVar6 = RVar2 >> 3;
  if (MVar3 != MPP_FMT_YUV444SP) {
    uVar6 = RVar2 >> 4;
  }
  *(uint *)((long)comParas + 0x20) = uVar6;
  *(uint *)((long)comParas + 0x24) = uVar8 >> 4;
  RVar1 = mpp_frame_get_thumbnail_en(frame);
  if (RVar1 == 1) {
    uVar7 = ((int)sVar5 - (uVar7 + 0xf & 0xfffffff0)) + 0xf & 0xfffffff0;
    mpp_dev_set_reg_offset(dev,0x85,uVar7);
    mpp_meta_set_s32(meta,KEY_DEC_TBN_Y_OFFSET,uVar7);
    mpp_meta_set_s32(meta,KEY_DEC_TBN_UV_OFFSET,uVar8 + uVar7);
    return;
  }
  return;
}

Assistant:

void vdpu384a_setup_down_scale(MppFrame frame, MppDev dev, Vdpu384aCtrlReg *com, void* comParas)
{
    RK_U32 down_scale_height = mpp_frame_get_height(frame) >> 1;
    RK_U32 down_scale_width = mpp_frame_get_width(frame) >> 1;
    RK_U32 down_scale_ver = MPP_ALIGN(down_scale_height, 16);
    RK_U32 down_scale_hor = MPP_ALIGN(down_scale_width, 16);

    Vdpu384aRegCommParas* paras = (Vdpu384aRegCommParas*)comParas;
    MppFrameFormat fmt = mpp_frame_get_fmt(frame);
    MppMeta meta = mpp_frame_get_meta(frame);
    RK_U32 down_scale_y_offset = 0;
    RK_U32 down_scale_uv_offset = 0;
    RK_U32 down_scale_y_virstride = down_scale_ver * down_scale_hor;
    RK_U32 downscale_buf_size;

    if (!MPP_FRAME_FMT_IS_FBC(mpp_frame_get_fmt(frame))) {
        down_scale_hor = mpp_align_128_odd_plus_64(down_scale_hor);
        down_scale_ver = mpp_frame_get_ver_stride(frame) >> 1;
        down_scale_y_virstride = down_scale_ver * down_scale_hor;
    }
    /*
     *  no matter what format, scale down image will output as 8bit raster format;
     *  down_scale image buffer size was already added to the buf_size of mpp_frame,
     *  which was calculated in mpp_buf_slot.cpp: (size = original_size + scaledown_size)
     */
    switch ((fmt & MPP_FRAME_FMT_MASK)) {
    case MPP_FMT_YUV400 : {
        downscale_buf_size = down_scale_y_virstride;
    } break;
    case MPP_FMT_YUV420SP_10BIT :
    case MPP_FMT_YUV420SP : {
        downscale_buf_size = down_scale_y_virstride * 3 / 2;
    } break;
    case MPP_FMT_YUV422SP_10BIT :
    case MPP_FMT_YUV422SP : {
        downscale_buf_size = down_scale_y_virstride * 2;
    } break;
    case MPP_FMT_YUV444SP : {
        downscale_buf_size = down_scale_y_virstride * 3;
    } break;
    default : {
        downscale_buf_size = down_scale_y_virstride * 3 / 2;
    } break;
    }
    downscale_buf_size = MPP_ALIGN(downscale_buf_size, 16);

    down_scale_y_offset = MPP_ALIGN((mpp_frame_get_buf_size(frame) - downscale_buf_size), 16);
    down_scale_uv_offset = down_scale_y_offset + down_scale_y_virstride;

    com->reg9.scale_down_en = 1;
    com->reg9.av1_fgs_en = 0;
    paras->reg71_scl_ref_hor_virstride = down_scale_hor >> 4;
    paras->reg72_scl_ref_raster_uv_hor_virstride = down_scale_hor >> 4;
    if ((fmt & MPP_FRAME_FMT_MASK) == MPP_FMT_YUV444SP)
        paras->reg72_scl_ref_raster_uv_hor_virstride = down_scale_hor >> 3;
    paras->reg73_scl_ref_virstride = down_scale_y_virstride >> 4;
    if (mpp_frame_get_thumbnail_en(frame) == MPP_FRAME_THUMBNAIL_MIXED) {
        mpp_dev_set_reg_offset(dev, 133, down_scale_y_offset);
        mpp_meta_set_s32(meta, KEY_DEC_TBN_Y_OFFSET, down_scale_y_offset);
        mpp_meta_set_s32(meta, KEY_DEC_TBN_UV_OFFSET, down_scale_uv_offset);
    }
}